

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowTabBar::~QMainWindowTabBar(QMainWindowTabBar *this)

{
  int *piVar1;
  long lVar2;
  QMainWindowLayout *pQVar3;
  long in_FS_OFFSET;
  QMainWindowTabBar *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_00802eb8;
  *(undefined ***)(this + 0x10) = &PTR__QMainWindowTabBar_00803098;
  lVar2 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  if ((lVar2 != 0) &&
     (*(QMainWindow **)(this + 0x28) != *(QMainWindow **)(*(long *)(this + 8) + 0x10))) {
    pQVar3 = qt_mainwindow_layout(*(QMainWindow **)(this + 0x28));
    if (pQVar3 != (QMainWindowLayout *)0x0) {
      local_28 = (QMainWindowTabBar *)this;
      QtPrivate::sequential_erase_one<QList<QTabBar*>,QMainWindowTabBar*>
                (&pQVar3->unusedTabBars,&local_28);
      local_28 = (QMainWindowTabBar *)this;
      QHash<QTabBar*,QHashDummyValue>::removeImpl<QTabBar*>
                ((QHash<QTabBar*,QHashDummyValue> *)&pQVar3->usedTabBars,(QTabBar **)&local_28);
    }
  }
  piVar1 = *(int **)(this + 0x30);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (*(void **)(this + 0x30) != (void *)0x0)) {
      operator_delete(*(void **)(this + 0x30));
    }
  }
  QTabBar::~QTabBar((QTabBar *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMainWindowTabBar::~QMainWindowTabBar()
{
    // Use qobject_cast to verify that we are not already in the (QWidget)
    // destructor of mainWindow
    if (!qobject_cast<QMainWindow *>(mainWindow) || mainWindow == parentWidget())
        return;

    // tab bar is not parented to the main window
    // => can only be a dock widget group window
    // => remove itself from used and unused tab bar containers
    auto *mwLayout = qt_mainwindow_layout(mainWindow);
    if (!mwLayout)
        return;
    mwLayout->unusedTabBars.removeOne(this);
    mwLayout->usedTabBars.remove(this);
}